

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.hpp
# Opt level: O0

void __thiscall glcts::TessellationShadersIsolines::_test_result::_test_result(_test_result *this)

{
  _test_result *this_local;
  
  std::vector<float,_std::allocator<float>_>::vector(&this->rendered_data);
  this->n_isolines = 0;
  this->n_vertices = 0;
  this->parent = (_test_descriptor *)0x0;
  std::vector<float,_std::allocator<float>_>::clear(&this->rendered_data);
  this->irrelevant_tess_level = 0;
  this->outer1_tess_level = 0;
  this->outer2_tess_level = 0;
  return;
}

Assistant:

_test_result()
		{
			n_isolines = 0;
			n_vertices = 0;
			parent	 = DE_NULL;
			rendered_data.clear();

			irrelevant_tess_level = 0;
			outer1_tess_level	 = 0;
			outer2_tess_level	 = 0;
		}